

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildInit(ImFontAtlas *atlas)

{
  int iVar1;
  long in_RDI;
  int in_stack_00000028;
  int in_stack_0000002c;
  ImFontAtlas *in_stack_00000030;
  
  if (*(int *)(in_RDI + 0x70) < 0) {
    if ((*(uint *)(in_RDI + 4) & 2) == 0) {
      iVar1 = ImFontAtlas::AddCustomRectRegular
                        (in_stack_00000030,in_stack_0000002c,in_stack_00000028);
      *(int *)(in_RDI + 0x70) = iVar1;
    }
    else {
      iVar1 = ImFontAtlas::AddCustomRectRegular
                        (in_stack_00000030,in_stack_0000002c,in_stack_00000028);
      *(int *)(in_RDI + 0x70) = iVar1;
    }
  }
  return;
}

Assistant:

void ImFontAtlasBuildInit(ImFontAtlas* atlas)
{
    if (atlas->CustomRectIds[0] >= 0)
        return;
    if (!(atlas->Flags & ImFontAtlasFlags_NoMouseCursors))
        atlas->CustomRectIds[0] = atlas->AddCustomRectRegular(FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF*2+1, FONT_ATLAS_DEFAULT_TEX_DATA_H);
    else
        atlas->CustomRectIds[0] = atlas->AddCustomRectRegular(2, 2);
}